

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O1

void __thiscall QGraphicsWidget::insertAction(QGraphicsWidget *this,QAction *before,QAction *action)

{
  QPodArrayOps<QAction*> *this_00;
  long lVar1;
  long *plVar2;
  long lVar3;
  QAction *pQVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  QPodArrayOps<QObject*> *this_01;
  long in_FS_OFFSET;
  QAction *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0) {
    insertAction();
    goto LAB_0064b830;
  }
  lVar3 = *(long *)(this + 0x18);
  if (*(long *)(lVar3 + 0x200) == 0) {
LAB_0064b731:
    iVar5 = -1;
  }
  else {
    lVar7 = local_38;
    lVar6 = -8;
    do {
      iVar5 = (int)lVar7;
      lVar8 = *(long *)(lVar3 + 0x200) * -8 + lVar6;
      if (lVar8 == -8) goto LAB_0064b72b;
      lVar7 = lVar6 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x1f8) + 8 + lVar6);
      lVar6 = lVar7;
    } while ((QAction *)*plVar2 != action);
    iVar5 = (int)(lVar7 >> 3);
LAB_0064b72b:
    if (lVar8 == -8) goto LAB_0064b731;
  }
  this_00 = (QPodArrayOps<QAction*> *)(lVar3 + 0x1f0);
  lVar7 = 0xffffffff;
  if (iVar5 != -1) {
    QList<QAction_*>::removeAt((QList<QAction_*> *)this_00,(long)iVar5);
  }
  lVar6 = *(long *)(lVar3 + 0x200);
  if (lVar6 == 0) {
LAB_0064b79d:
    lVar7 = -1;
  }
  else {
    lVar8 = -8;
    do {
      lVar1 = lVar6 * -8 + lVar8;
      if (lVar1 == -8) goto LAB_0064b797;
      lVar7 = lVar8 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x1f8) + 8 + lVar8);
      lVar8 = lVar7;
    } while ((QAction *)*plVar2 != before);
    lVar7 = lVar7 >> 3;
LAB_0064b797:
    if (lVar1 == -8) goto LAB_0064b79d;
  }
  pQVar4 = (QAction *)0x0;
  if (-1 < (int)lVar7) {
    lVar6 = lVar7;
    pQVar4 = before;
  }
  local_58 = action;
  QtPrivate::QPodArrayOps<QAction*>::emplace<QAction*&>(this_00,(long)(int)lVar6,&local_58);
  QList<QAction_*>::begin((QList<QAction_*> *)this_00);
  if (iVar5 == -1) {
    this_01 = (QPodArrayOps<QObject*> *)(*(long *)(action + 8) + 0x140);
    local_58 = (QAction *)this;
    QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
              (this_01,*(qsizetype *)(*(long *)(action + 8) + 0x150),(QObject **)&local_58);
    QList<QObject_*>::end((QList<QObject_*> *)this_01);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QAction *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QActionEvent::QActionEvent((QActionEvent *)&local_58,0x72,action,pQVar4);
  QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_58);
  QActionEvent::~QActionEvent((QActionEvent *)&local_58);
LAB_0064b830:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidget::insertAction(QAction *before, QAction *action)
{
    if (!action) {
        qWarning("QWidget::insertAction: Attempt to insert null action");
        return;
    }

    Q_D(QGraphicsWidget);
    int index = d->actions.indexOf(action);
    if (index != -1)
        d->actions.removeAt(index);

    int pos = d->actions.indexOf(before);
    if (pos < 0) {
        before = nullptr;
        pos = d->actions.size();
    }
    d->actions.insert(pos, action);

    if (index == -1) {
        QActionPrivate *apriv = action->d_func();
        apriv->associatedObjects.append(this);
    }

    QActionEvent e(QEvent::ActionAdded, action, before);
    QCoreApplication::sendEvent(this, &e);
}